

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_bool j2k_read_tile_header
                   (opj_j2k_v2_t *p_j2k,OPJ_UINT32 *p_tile_index,OPJ_UINT32 *p_data_size,
                   OPJ_INT32 *p_tile_x0,OPJ_INT32 *p_tile_y0,OPJ_INT32 *p_tile_x1,
                   OPJ_INT32 *p_tile_y1,OPJ_UINT32 *p_nb_comps,opj_bool *p_go_on,
                   opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 tileno;
  uint uVar1;
  opj_tcp_v2_t *poVar2;
  opj_codestream_index_t *poVar3;
  opj_tp_index_t *poVar4;
  opj_tcd_tile_v2_t *poVar5;
  opj_dec_memory_marker_handler_t *poVar6;
  OPJ_UINT32 *pOVar7;
  OPJ_INT32 *pOVar8;
  OPJ_INT32 *pOVar9;
  byte bVar10;
  uint uVar11;
  OPJ_SIZE_T OVar12;
  opj_bool oVar13;
  OPJ_UINT32 OVar14;
  OPJ_OFF_T OVar15;
  OPJ_BYTE *pOVar16;
  ulong uVar17;
  OPJ_BYTE **ppOVar18;
  char *fmt;
  opj_dec_memory_marker_handler_t *e;
  opj_dec_memory_marker_handler_t *poVar19;
  uint uVar20;
  bool bVar21;
  OPJ_UINT32 local_60;
  OPJ_SIZE_T local_5c;
  OPJ_INT32 *local_58;
  OPJ_UINT32 *local_50;
  OPJ_INT32 *local_48;
  OPJ_INT32 *local_40;
  OPJ_UINT32 *local_38;
  
  local_60 = 0xff90;
  OVar14 = (p_j2k->m_specific_param).m_decoder.m_state;
  local_58 = p_tile_x0;
  local_38 = p_tile_index;
  if (OVar14 == 8) {
    bVar10 = *(byte *)((long)&p_j2k->m_specific_param + 0x54);
    pOVar7 = p_data_size;
    pOVar8 = p_tile_y0;
    pOVar9 = p_tile_x1;
    if ((bVar10 & 1) == 0) {
      do {
        local_40 = pOVar9;
        local_48 = pOVar8;
        local_50 = pOVar7;
        if (local_60 != 0xff93) {
          do {
            OVar12 = opj_stream_read_data
                               (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,
                                p_manager);
            if (OVar12 != 2) goto LAB_001f4b03;
            opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_5c,2);
            uVar11 = (p_j2k->m_specific_param).m_decoder.m_state;
            if ((uVar11 & 0x10) != 0) {
              (p_j2k->m_specific_param).m_decoder.m_sot_length =
                   ((p_j2k->m_specific_param).m_decoder.m_sot_length - local_5c) - 2;
            }
            local_5c = local_5c - 2;
            poVar6 = j2k_memory_marker_handler_tab;
            do {
              poVar19 = poVar6;
              OVar14 = poVar19->id;
              if (OVar14 == 0) break;
              poVar6 = poVar19 + 1;
            } while (OVar14 != local_60);
            if ((poVar19->states & uVar11) == 0) {
              fmt = "Marker is not compliant with its position\n";
              goto LAB_001f4b13;
            }
            pOVar16 = (p_j2k->m_specific_param).m_decoder.m_header_data;
            if ((p_j2k->m_specific_param).m_decoder.m_header_data_size < local_5c) {
              pOVar16 = (OPJ_BYTE *)realloc(pOVar16,(ulong)local_5c);
              (p_j2k->m_specific_param).m_decoder.m_header_data = pOVar16;
              if (pOVar16 == (OPJ_BYTE *)0x0) {
                return 0;
              }
              (p_j2k->m_specific_param).m_decoder.m_header_data_size = local_5c;
            }
            OVar12 = opj_stream_read_data(p_stream,pOVar16,local_5c,p_manager);
            if (OVar12 != local_5c) goto LAB_001f4b03;
            oVar13 = (*poVar19->handler)(p_j2k,(p_j2k->m_specific_param).m_decoder.m_header_data,
                                         OVar12,p_manager);
            if (oVar13 == 0) {
              opj_event_msg_v2(p_manager,1,"Fail to read the current marker segment (%#x)\n",
                               (ulong)local_60);
              return 0;
            }
            tileno = p_j2k->m_current_tile_number;
            poVar3 = p_j2k->cstr_index;
            OVar15 = opj_stream_tell(p_stream);
            j2k_add_tlmarker_v2(tileno,poVar3,OVar14,(ulong)(((int)OVar15 - local_5c) - 4),
                                local_5c + 4);
            if (OVar14 == 0xff90) {
              OVar15 = opj_stream_tell(p_stream);
              uVar17 = (ulong)(((int)OVar15 - local_5c) - 4);
              if ((p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos < (long)uVar17) {
                (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = uVar17;
              }
            }
            if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 4) != 0) {
              uVar17 = opj_stream_skip(p_stream,(ulong)(p_j2k->m_specific_param).m_decoder.
                                                       m_sot_length,p_manager);
              if (uVar17 != (p_j2k->m_specific_param).m_decoder.m_sot_length) goto LAB_001f4b03;
              local_60 = 0xff93;
              break;
            }
            OVar12 = opj_stream_read_data
                               (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,
                                p_manager);
            if (OVar12 != 2) goto LAB_001f4b03;
            opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_60,2);
          } while (local_60 != 0xff93);
          bVar10 = *(byte *)((long)&p_j2k->m_specific_param + 0x54);
        }
        if ((bVar10 & 4) == 0) {
          uVar11 = p_j2k->m_current_tile_number;
          poVar2 = (p_j2k->m_cp).tcps;
          if ((p_j2k->m_specific_param).m_decoder.m_last_tile_part == 0) {
            OVar14 = (p_j2k->m_specific_param).m_decoder.m_sot_length;
          }
          else {
            OVar15 = opj_stream_get_number_byte_left(p_stream);
            OVar14 = (OPJ_UINT32)OVar15;
          }
          uVar20 = OVar14 - 2;
          (p_j2k->m_specific_param).m_decoder.m_sot_length = uVar20;
          if (poVar2[uVar11].m_data == (OPJ_BYTE *)0x0) {
            pOVar16 = (OPJ_BYTE *)malloc((ulong)uVar20);
          }
          else {
            pOVar16 = (OPJ_BYTE *)
                      realloc(poVar2[uVar11].m_data,(ulong)(uVar20 + poVar2[uVar11].m_data_size));
          }
          poVar2[uVar11].m_data = pOVar16;
          if (pOVar16 == (OPJ_BYTE *)0x0) {
            fmt = "Cannot decode tile\n";
            goto LAB_001f4b13;
          }
          poVar3 = p_j2k->cstr_index;
          if (poVar3 != (opj_codestream_index_t *)0x0) {
            OVar15 = opj_stream_tell(p_stream);
            uVar20 = p_j2k->m_current_tile_number;
            uVar1 = poVar3->tile_index[uVar20].current_tpsno;
            poVar4 = poVar3->tile_index[uVar20].tp_index;
            poVar4[uVar1].end_header = OVar15 + -2;
            poVar4[uVar1].end_pos = (ulong)(p_j2k->m_specific_param).m_decoder.m_sot_length + OVar15
            ;
            j2k_add_tlmarker_v2(uVar20,poVar3,0xff93,OVar15 + -2,
                                (p_j2k->m_specific_param).m_decoder.m_sot_length + 2);
            pOVar16 = poVar2[uVar11].m_data;
          }
          OVar12 = opj_stream_read_data
                             (p_stream,pOVar16 + poVar2[uVar11].m_data_size,
                              (p_j2k->m_specific_param).m_decoder.m_sot_length,p_manager);
          OVar14 = 0x40;
          if (OVar12 == (p_j2k->m_specific_param).m_decoder.m_sot_length) {
            OVar14 = 8;
          }
          (p_j2k->m_specific_param).m_decoder.m_state = OVar14;
          poVar2[uVar11].m_data_size = poVar2[uVar11].m_data_size + OVar12;
          if ((*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0) goto LAB_001f49a3;
        }
        else {
          *(byte *)((long)&p_j2k->m_specific_param + 0x54) = bVar10 & 0xfa;
          (p_j2k->m_specific_param).m_decoder.m_state = 8;
LAB_001f49a3:
          OVar12 = opj_stream_read_data
                             (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager
                             );
          if (OVar12 != 2) {
LAB_001f4b03:
            fmt = "Stream too short\n";
            goto LAB_001f4b13;
          }
          opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_60,2);
        }
        bVar10 = *(byte *)((long)&p_j2k->m_specific_param + 0x54);
        bVar21 = (bVar10 & 1) == 0;
      } while ((bVar21) &&
              (pOVar7 = local_50, pOVar8 = local_48, pOVar9 = local_40, local_60 != 0xffd9));
      p_data_size = local_50;
      p_tile_x1 = local_40;
      p_tile_y0 = local_48;
      if (local_60 == 0xffd9) goto LAB_001f4657;
      goto LAB_001f4674;
    }
  }
  else {
    if (OVar14 != 0x100) {
      return 0;
    }
    local_60 = 0xffd9;
    bVar21 = (*(byte *)((long)&p_j2k->m_specific_param + 0x54) & 1) == 0;
LAB_001f4657:
    if ((p_j2k->m_specific_param).m_decoder.m_state != 0x100) {
      p_j2k->m_current_tile_number = 0;
      (p_j2k->m_specific_param).m_decoder.m_state = 0x100;
    }
LAB_001f4674:
    if (bVar21) {
      OVar14 = p_j2k->m_current_tile_number;
      uVar17 = (ulong)OVar14;
      uVar11 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
      if (OVar14 < uVar11) {
        ppOVar18 = &(p_j2k->m_cp).tcps[uVar17].m_data;
        do {
          OVar14 = (OPJ_UINT32)uVar17;
          if (*ppOVar18 != (OPJ_BYTE *)0x0) goto LAB_001f4ae6;
          uVar20 = OVar14 + 1;
          uVar17 = (ulong)uVar20;
          p_j2k->m_current_tile_number = uVar20;
          ppOVar18 = ppOVar18 + 0x2c6;
        } while (uVar11 != uVar20);
LAB_001f4aee:
        *p_go_on = 0;
        return 1;
      }
LAB_001f4ae6:
      if (OVar14 == uVar11) goto LAB_001f4aee;
      goto LAB_001f4a2b;
    }
  }
  OVar14 = p_j2k->m_current_tile_number;
LAB_001f4a2b:
  oVar13 = tcd_init_decode_tile(p_j2k->m_tcd,OVar14);
  if (oVar13 != 0) {
    opj_event_msg_v2(p_manager,4,"Header of tile %d / %d has been read.\n",
                     (ulong)p_j2k->m_current_tile_number,
                     (ulong)((p_j2k->m_cp).tw * (p_j2k->m_cp).th - 1));
    *local_38 = p_j2k->m_current_tile_number;
    *p_go_on = 1;
    OVar14 = tcd_get_decoded_tile_size(p_j2k->m_tcd);
    *p_data_size = OVar14;
    poVar5 = p_j2k->m_tcd->tcd_image->tiles;
    *local_58 = poVar5->x0;
    *p_tile_y0 = poVar5->y0;
    *p_tile_x1 = poVar5->x1;
    *p_tile_y1 = poVar5->y1;
    *p_nb_comps = poVar5->numcomps;
    *(byte *)&p_j2k->m_specific_param = *(byte *)&p_j2k->m_specific_param | 0x80;
    return 1;
  }
  fmt = "Cannot decode tile, memory error\n";
LAB_001f4b13:
  opj_event_msg_v2(p_manager,1,fmt);
  return 0;
}

Assistant:

opj_bool j2k_read_tile_header(	opj_j2k_v2_t * p_j2k,
					 	 	 	OPJ_UINT32 * p_tile_index,
					 	 	 	OPJ_UINT32 * p_data_size,
					 	 	 	OPJ_INT32 * p_tile_x0, OPJ_INT32 * p_tile_y0,
					 	 	 	OPJ_INT32 * p_tile_x1, OPJ_INT32 * p_tile_y1,
								OPJ_UINT32 * p_nb_comps,
								opj_bool * p_go_on,
								opj_stream_private_t *p_stream,
								opj_event_mgr_t * p_manager )
{
	OPJ_UINT32 l_current_marker = J2K_MS_SOT;
	OPJ_UINT32 l_marker_size;
	const opj_dec_memory_marker_handler_t * l_marker_handler = 00;
	opj_tcp_v2_t * l_tcp = NULL;
	OPJ_UINT32 l_nb_tiles;

	/* preconditions */
	assert(p_stream != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	/* Reach the End Of Codestream ?*/
	if (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_EOC){
		l_current_marker = J2K_MS_EOC;
	}
	/* We need to encounter a SOT marker (a new tile-part header) */
	else if	(p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT){
		return OPJ_FALSE;
	}

	/* Read into the codestream until reach the EOC or ! can_decode ??? FIXME */
	while ( (!p_j2k->m_specific_param.m_decoder.m_can_decode) && (l_current_marker != J2K_MS_EOC) ) {

		/* Try to read until the Start Of Data is detected */
		while (l_current_marker != J2K_MS_SOD) {

			/* Try to read 2 bytes (the marker size) from stream and copy them into the buffer */
			if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
				return OPJ_FALSE;
			}

			/* Read 2 bytes from the buffer as the marker size */
			opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_marker_size,2);

			/* Why this condition? FIXME */
			if (p_j2k->m_specific_param.m_decoder.m_state & J2K_STATE_TPH){
				p_j2k->m_specific_param.m_decoder.m_sot_length -= (l_marker_size + 2);
			}
			l_marker_size -= 2; /* Subtract the size of the marker ID already read */

			/* Get the marker handler from the marker ID */
			l_marker_handler = j2k_get_marker_handler(l_current_marker);

			/* Check if the marker is known and if it is the right place to find it */
			if (! (p_j2k->m_specific_param.m_decoder.m_state & l_marker_handler->states) ) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Marker is not compliant with its position\n");
				return OPJ_FALSE;
			}
/* FIXME manage case of unknown marker as in the main header ? */

			/* Check if the marker size is compatible with the header data size */
			if (l_marker_size > p_j2k->m_specific_param.m_decoder.m_header_data_size) {
				p_j2k->m_specific_param.m_decoder.m_header_data = (OPJ_BYTE*)
					opj_realloc(p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size);
				if (p_j2k->m_specific_param.m_decoder.m_header_data == 00) {
					return OPJ_FALSE;
				}
				p_j2k->m_specific_param.m_decoder.m_header_data_size = l_marker_size;
			}

			/* Try to read the rest of the marker segment from stream and copy them into the buffer */
			if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager) != l_marker_size) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
				return OPJ_FALSE;
			}

			/* Read the marker segment with the correct marker handler */
			if (! (*(l_marker_handler->handler))(p_j2k,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager)) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Fail to read the current marker segment (%#x)\n", l_current_marker);
				return OPJ_FALSE;
			}

			/* Add the marker to the codestream index*/
			j2k_add_tlmarker_v2(p_j2k->m_current_tile_number,
								p_j2k->cstr_index,
								l_marker_handler->id,
								(OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4,
								l_marker_size + 4 );

			/* Keep the position of the last SOT marker read */
			if ( l_marker_handler->id == J2K_MS_SOT ) {
				OPJ_UINT32 sot_pos = (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4 ;
				if (sot_pos > p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos)
				{
					p_j2k->m_specific_param.m_decoder.m_last_sot_read_pos = sot_pos;
				}
			}


			if (p_j2k->m_specific_param.m_decoder.m_skip_data) {
				/* Skip the rest of the tile part header*/
				if (opj_stream_skip(p_stream,p_j2k->m_specific_param.m_decoder.m_sot_length,p_manager) != p_j2k->m_specific_param.m_decoder.m_sot_length) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
					return OPJ_FALSE;
				}
				l_current_marker = J2K_MS_SOD; /* Normally we reached a SOD */
			}
			else {
				/* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer*/
				if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
					return OPJ_FALSE;
				}
				/* Read 2 bytes from the buffer as the new marker ID */
				opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
			}
		}

		/* If we didn't skip data before, we need to read the SOD marker*/
		if (! p_j2k->m_specific_param.m_decoder.m_skip_data) {
			/* Try to read the SOD marker and skip data ? FIXME */
			if (! j2k_read_sod_v2(p_j2k, p_stream, p_manager)) {
				return OPJ_FALSE;
			}



			if (! p_j2k->m_specific_param.m_decoder.m_can_decode){
				/* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
				if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
					opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
					return OPJ_FALSE;
				}

				/* Read 2 bytes from buffer as the new marker ID */
				opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
			}
		}
		else {
			/* Indicate we will try to read a new tile-part header*/
			p_j2k->m_specific_param.m_decoder.m_skip_data = 0;
			p_j2k->m_specific_param.m_decoder.m_can_decode = 0;
			p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_TPHSOT;

			/* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
			if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Stream too short\n");
				return OPJ_FALSE;
			}

			/* Read 2 bytes from buffer as the new marker ID */
			opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
		}
	}

	/* Current marker is the EOC marker ?*/
	if (l_current_marker == J2K_MS_EOC) {
		if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_EOC ){
			p_j2k->m_current_tile_number = 0;
			p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_EOC;
		}
	}

	/* FIXME DOC ???*/
	if ( ! p_j2k->m_specific_param.m_decoder.m_can_decode) {
		l_tcp = p_j2k->m_cp.tcps + p_j2k->m_current_tile_number;
		l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;

		while( (p_j2k->m_current_tile_number < l_nb_tiles) && (l_tcp->m_data == 00) ) {
			++p_j2k->m_current_tile_number;
			++l_tcp;
		}

		if (p_j2k->m_current_tile_number == l_nb_tiles) {
			*p_go_on = OPJ_FALSE;
			return OPJ_TRUE;
		}
	}

	/*FIXME ???*/
	if (! tcd_init_decode_tile(p_j2k->m_tcd, p_j2k->m_current_tile_number)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Cannot decode tile, memory error\n");
		return OPJ_FALSE;
	}

	opj_event_msg_v2(p_manager, EVT_INFO, "Header of tile %d / %d has been read.\n",
			p_j2k->m_current_tile_number, (p_j2k->m_cp.th * p_j2k->m_cp.tw) - 1);

	*p_tile_index = p_j2k->m_current_tile_number;
	*p_go_on = OPJ_TRUE;
	*p_data_size = tcd_get_decoded_tile_size(p_j2k->m_tcd);
	*p_tile_x0 = p_j2k->m_tcd->tcd_image->tiles->x0;
	*p_tile_y0 = p_j2k->m_tcd->tcd_image->tiles->y0;
	*p_tile_x1 = p_j2k->m_tcd->tcd_image->tiles->x1;
	*p_tile_y1 = p_j2k->m_tcd->tcd_image->tiles->y1;
	*p_nb_comps = p_j2k->m_tcd->tcd_image->tiles->numcomps;

	 p_j2k->m_specific_param.m_decoder.m_state |= 0x0080;/* FIXME J2K_DEC_STATE_DATA;*/

	return OPJ_TRUE;
}